

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O3

aom_denoise_and_model_t *
aom_denoise_and_model_alloc(int bit_depth,int block_size,float noise_level)

{
  aom_denoise_and_model_t *paVar1;
  float *pfVar2;
  size_t size;
  
  paVar1 = (aom_denoise_and_model_t *)aom_malloc(0x348);
  if (paVar1 == (aom_denoise_and_model_t *)0x0) {
    aom_denoise_and_model_alloc_cold_2();
  }
  else {
    memset(&paVar1->noise_level,0,0x340);
    paVar1->block_size = block_size;
    paVar1->noise_level = noise_level;
    paVar1->bit_depth = bit_depth;
    size = (long)block_size * (long)block_size * 4;
    pfVar2 = (float *)aom_malloc(size);
    paVar1->noise_psd[0] = pfVar2;
    pfVar2 = (float *)aom_malloc(size);
    paVar1->noise_psd[1] = pfVar2;
    pfVar2 = (float *)aom_malloc(size);
    paVar1->noise_psd[2] = pfVar2;
    if (((paVar1->noise_psd[0] != (float *)0x0) && (paVar1->noise_psd[1] != (float *)0x0)) &&
       (pfVar2 != (float *)0x0)) {
      return paVar1;
    }
    aom_denoise_and_model_alloc_cold_1();
  }
  return (aom_denoise_and_model_t *)0x0;
}

Assistant:

struct aom_denoise_and_model_t *aom_denoise_and_model_alloc(int bit_depth,
                                                            int block_size,
                                                            float noise_level) {
  struct aom_denoise_and_model_t *ctx =
      (struct aom_denoise_and_model_t *)aom_malloc(
          sizeof(struct aom_denoise_and_model_t));
  if (!ctx) {
    fprintf(stderr, "Unable to allocate denoise_and_model struct\n");
    return NULL;
  }
  memset(ctx, 0, sizeof(*ctx));

  ctx->block_size = block_size;
  ctx->noise_level = noise_level;
  ctx->bit_depth = bit_depth;

  ctx->noise_psd[0] =
      (float *)aom_malloc(sizeof(*ctx->noise_psd[0]) * block_size * block_size);
  ctx->noise_psd[1] =
      (float *)aom_malloc(sizeof(*ctx->noise_psd[1]) * block_size * block_size);
  ctx->noise_psd[2] =
      (float *)aom_malloc(sizeof(*ctx->noise_psd[2]) * block_size * block_size);
  if (!ctx->noise_psd[0] || !ctx->noise_psd[1] || !ctx->noise_psd[2]) {
    fprintf(stderr, "Unable to allocate noise PSD buffers\n");
    aom_denoise_and_model_free(ctx);
    return NULL;
  }
  return ctx;
}